

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

void CVmObjList::add_to_list(vm_val_t *result,vm_obj_id_t self,char *lstval,vm_val_t *rhs)

{
  CVmObjPageEntry *this;
  anon_union_8_8_cb74652f_for_val aVar1;
  vm_datatype_t *pvVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  ulong uVar8;
  ulong idx;
  vm_val_t val;
  
  pvVar4 = sp_;
  pvVar2 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar2 = VM_OBJ;
  (pvVar4->val).obj = self;
  pvVar4 = sp_;
  uVar3 = *(undefined4 *)&rhs->field_0x4;
  aVar1 = rhs->val;
  sp_ = sp_ + 1;
  pvVar4->typ = rhs->typ;
  *(undefined4 *)&pvVar4->field_0x4 = uVar3;
  pvVar4->val = aVar1;
  idx = (ulong)*(ushort *)lstval;
  iVar5 = vm_val_t::is_listlike(rhs);
  if (iVar5 == 0) {
    iVar5 = -1;
  }
  else {
    iVar5 = vm_val_t::ll_length(rhs);
  }
  iVar6 = 1;
  if (-1 < iVar5) {
    iVar6 = iVar5;
  }
  vVar7 = create(0,(long)iVar6 + idx & 0xffffffff);
  this = G_obj_table_X.pages_[vVar7 >> 0xc] + (vVar7 & 0xfff);
  memcpy((void *)(*(long *)((long)&G_obj_table_X.pages_[vVar7 >> 0xc][vVar7 & 0xfff].ptr_ + 8) + 2),
         lstval + 2,(ulong)*(ushort *)lstval * 5);
  if (iVar5 < 0) {
    cons_set_element((CVmObjList *)this,idx,rhs);
  }
  else {
    cons_clear((CVmObjList *)this,idx,((long)iVar6 + idx) - 1);
    for (uVar8 = 1; iVar5 + 1 != uVar8; uVar8 = uVar8 + 1) {
      vm_val_t::ll_index(rhs,&val,(int)uVar8);
      cons_set_element((CVmObjList *)this,(long)(int)idx,&val);
      idx = (ulong)((int)idx + 1);
    }
  }
  result->typ = VM_OBJ;
  (result->val).obj = vVar7;
  sp_ = sp_ + -2;
  return;
}

Assistant:

void CVmObjList::add_to_list(VMG_ vm_val_t *result,
                             vm_obj_id_t self, const char *lstval,
                             const vm_val_t *rhs)
{
    int lhs_cnt, rhs_cnt, alo_cnt;
    vm_obj_id_t obj;
    CVmObjList *objptr;

    /* push self and the other list for protection against GC */
    G_stk->push()->set_obj(self);
    G_stk->push(rhs);

    /* get the number of elements in the left-hand ('self') side */
    lhs_cnt = vmb_get_len(lstval);

    /* get the number of elements the right-hand side concatenates */
    rhs_cnt = (rhs->is_listlike(vmg0_) ? rhs->ll_length(vmg0_) : -1);

    /* if it's not a list, allocate on element */
    alo_cnt = (rhs_cnt < 0 ? 1 : rhs_cnt);

    /* allocate a new object to hold the new list */
    obj = create(vmg_ FALSE, lhs_cnt + alo_cnt);
    objptr = (CVmObjList *)vm_objp(vmg_ obj);

    /* copy the first list into the new object's list buffer */
    objptr->cons_copy_elements(0, lstval);

    /* add the value or its contents */
    if (rhs_cnt < 0)
    {
        /* single value - add it as-is */
        objptr->cons_set_element(lhs_cnt, rhs);
    }
    else
    {
        /* 
         *   clear the rest of the list, in case gc runs while retrieving
         *   elements from the rhs 
         */
        objptr->cons_clear(lhs_cnt, lhs_cnt + alo_cnt - 1);

        /* add each element from the right-hand side */
        for (int i = 1 ; i <= rhs_cnt ; ++i)
        {
            /* retrieve this element of the rhs */
            vm_val_t val;
            rhs->ll_index(vmg_ &val, i);
                
            /* store the element in the new list */
            objptr->cons_set_element(lhs_cnt + i - 1, &val);
        }
    }

    /* set the result to the new list */
    result->set_obj(obj);

    /* discard the GC protection items */
    G_stk->discard(2);
}